

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcRamp::~IfcRamp(IfcRamp *this)

{
  long *plVar1;
  long lVar2;
  
  lVar2 = *(long *)(*(long *)this + -0x18);
  plVar1 = (long *)(&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRamp,_1UL>).field_0x20 +
                   lVar2);
  plVar1[-0x2d] = 0x817cd0;
  plVar1[2] = 0x817de8;
  plVar1[-0x1c] = 0x817cf8;
  plVar1[-0x1a] = 0x817d20;
  plVar1[-0x13] = 0x817d48;
  plVar1[-0xd] = 0x817d70;
  plVar1[-6] = 0x817d98;
  plVar1[-4] = 0x817dc0;
  if ((long *)plVar1[-2] != plVar1) {
    operator_delete((long *)plVar1[-2],*plVar1 + 1);
  }
  IfcElement::~IfcElement
            ((IfcElement *)(&this->field_0x0 + lVar2),&PTR_construction_vtable_24__00817e08);
  operator_delete((IfcElement *)(&this->field_0x0 + lVar2),400);
  return;
}

Assistant:

IfcRamp() : Object("IfcRamp") {}